

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

int ncnn::from_rgb2rgba(uchar *rgb,int w,int h,int stride,Mat *m,Allocator *allocator)

{
  int iVar1;
  long *in_R8;
  Mat alpha_channel;
  Mat rgb_channels;
  Mat *m_2;
  Mat *m_1;
  int i;
  float *ptr;
  int size;
  Allocator *in_stack_fffffffffffffd30;
  size_t in_stack_fffffffffffffd38;
  undefined8 in_stack_fffffffffffffd40;
  undefined8 in_stack_fffffffffffffd48;
  Mat *in_stack_fffffffffffffd50;
  bool local_291;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 local_280;
  undefined4 local_278;
  long local_270;
  undefined4 local_268;
  undefined4 local_264;
  undefined4 local_260;
  undefined4 local_25c;
  undefined4 local_258;
  undefined8 local_250;
  void *local_238;
  int *local_230;
  ulong local_228;
  undefined4 local_220;
  long *local_218;
  undefined4 local_210;
  int local_20c;
  int local_208;
  int local_204;
  undefined4 local_200;
  ulong local_1f8;
  long *local_1e8;
  int local_1c4;
  undefined8 *local_1c0;
  void **local_1b0;
  undefined1 local_195;
  undefined4 local_194;
  undefined8 *local_188;
  long *local_178;
  long local_170;
  undefined4 local_164;
  Allocator *in_stack_fffffffffffffea0;
  Mat *in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb4;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  uchar *in_stack_fffffffffffffec0;
  int local_fc;
  undefined4 *local_f8;
  
  local_1e8 = in_R8;
  Mat::create(in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20),
              (int)in_stack_fffffffffffffd48,(int)((ulong)in_stack_fffffffffffffd40 >> 0x20),
              in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  local_291 = true;
  if (*local_1e8 != 0) {
    local_178 = local_1e8;
    local_291 = local_1e8[8] * (long)(int)local_1e8[7] == 0;
  }
  if (local_291) {
    local_1c4 = -100;
  }
  else {
    local_20c = *(int *)((long)local_1e8 + 0x2c);
    local_208 = (int)local_1e8[6];
    local_204 = *(int *)((long)local_1e8 + 0x34);
    local_238 = (void *)*local_1e8;
    local_228 = local_1e8[2];
    local_220 = (undefined4)local_1e8[3];
    local_218 = (long *)local_1e8[4];
    local_230 = (int *)0x0;
    local_200 = 3;
    local_1f8 = ((long)local_20c * (long)local_208 * (long)local_204 * local_228 + 0xf &
                0xfffffffffffffff0) / local_228;
    local_210 = (undefined4)local_1e8[5];
    from_rgb(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,
             in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    local_188 = &local_290;
    iVar1 = *(int *)((long)local_1e8 + 0x34);
    local_164 = (undefined4)local_1e8[3];
    local_170 = local_1e8[4];
    local_250._0_4_ =
         (int)(((long)*(int *)((long)local_1e8 + 0x2c) * (long)(int)local_1e8[6] * local_1e8[2] +
                0xfU & 0xfffffffffffffff0) / (ulong)local_1e8[2]);
    if ((int)local_1e8[5] == 4) {
      local_250._0_4_ = *(int *)((long)local_1e8 + 0x2c) * (int)local_1e8[6];
    }
    local_f8 = (undefined4 *)(*local_1e8 + local_1e8[8] * 3 * local_1e8[2]);
    for (local_fc = 0; local_fc < (int)local_250 * iVar1; local_fc = local_fc + 1) {
      *local_f8 = 0x437f0000;
      local_f8 = local_f8 + 1;
    }
    local_1c0 = &local_290;
    local_194 = 3;
    local_195 = 1;
    local_1c4 = 0;
    local_290 = 0;
    local_280 = 0;
    local_278 = 0;
    local_268 = 0;
    local_264 = 0;
    local_260 = 0;
    local_25c = 0;
    local_258 = 0;
    local_250 = 0;
    local_288 = 0;
    local_1b0 = &local_238;
    if (local_230 != (int *)0x0) {
      LOCK();
      iVar1 = *local_230;
      *local_230 = *local_230 + -1;
      UNLOCK();
      if (iVar1 == 1) {
        local_270 = local_170;
        if (local_218 == (long *)0x0) {
          if (local_238 != (void *)0x0) {
            free(local_238);
          }
        }
        else {
          (**(code **)(*local_218 + 0x18))(local_218,local_238);
        }
      }
    }
  }
  return local_1c4;
}

Assistant:

static int from_rgb2rgba(const unsigned char* rgb, int w, int h, int stride, Mat& m, Allocator* allocator)
{
    m.create(w, h, 4, 4u, allocator);
    if (m.empty())
        return -100;

    Mat rgb_channels = m.channel_range(0, 3);
    from_rgb(rgb, w, h, stride, rgb_channels, allocator);

    Mat alpha_channel = m.channel(3);
    alpha_channel.fill(255.f);

    return 0;
}